

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  long *plVar1;
  simplex_t *psVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 _index [16];
  simplex_t sVar10;
  bool bVar11;
  char cVar12;
  simplex_t *psVar13;
  simplex_t *psVar14;
  logic_error *this_00;
  uint *puVar15;
  long in_RCX;
  int extraout_EDX;
  ulong extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  uint uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  undefined1 in_stack_ffffffffffffffb8 [12];
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar11 = has_next(this,all_cofacets);
  if (bVar11) {
    uVar16 = this->j;
    cVar12 = this->k;
    while( true ) {
      psVar13 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)uVar16,(int)cVar12,(dimension_t)in_RCX);
      uVar5 = *(ulong *)((long)&this->idx_below + 8);
      uVar17 = (ulong)(*(simplex_t **)&this->idx_below < psVar13);
      uVar8 = uVar5 - extraout_RDX;
      in_RCX = uVar8 - uVar17;
      if (uVar5 < extraout_RDX || uVar8 < uVar17) break;
      psVar14 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)this->k,(dimension_t)in_RCX);
      psVar13 = *(simplex_t **)&this->idx_below;
      *(long *)&this->idx_below = (long)this->idx_below - (long)psVar14;
      plVar1 = (long *)((long)&this->idx_below + 8);
      *plVar1 = (*plVar1 - extraout_RDX_00) - (ulong)(psVar13 < psVar14);
      psVar13 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)(char)(this->k + '\x01'),(dimension_t)in_RCX);
      psVar2 = &this->idx_above;
      sVar10 = *psVar2;
      *(long *)psVar2 = (long)*psVar2 + (long)psVar13;
      plVar1 = (long *)((long)&this->idx_above + 8);
      *plVar1 = *plVar1 + extraout_RDX_01 + (ulong)CARRY8((ulong)sVar10,(ulong)psVar13);
      uVar16 = this->j - 1;
      this->j = uVar16;
      cVar3 = this->k;
      cVar12 = cVar3 + -1;
      this->k = cVar12;
      if (cVar3 == '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    fVar18 = (this->simplex).
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
             .first;
    puVar15 = (uint *)(this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    puVar6 = (uint *)(this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    uVar16 = this->j;
    if (puVar15 != puVar6) {
      do {
        uVar4 = *puVar15;
        fVar19 = 0.0;
        if (uVar16 != uVar4) {
          uVar9 = uVar4;
          if ((int)uVar4 < (int)uVar16) {
            uVar9 = uVar16;
          }
          if ((int)uVar16 < (int)uVar4) {
            uVar4 = uVar16;
          }
          fVar19 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar9][(int)uVar4];
        }
        if (fVar19 <= fVar18) {
          fVar19 = fVar18;
        }
        fVar18 = fVar19;
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar6);
    }
    uVar5 = (ulong)this->idx_above;
    uVar7 = *(undefined8 *)((long)&this->idx_above + 8);
    this->j = uVar16 - 1;
    psVar13 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                         (ulong)uVar16,(int)(char)(this->k + '\x01'),(dimension_t)puVar6);
    uVar17 = uVar5 + (long)this->idx_below;
    _index._12_4_ = fVar18;
    _index._0_12_ = in_stack_ffffffffffffffb8;
    entry_with_coeff_t::entry_with_coeff_t
              ((entry_with_coeff_t *)&local_38,(simplex_t)_index,(int)uVar17 + (int)psVar13,
               extraout_EDX +
               (int)uVar7 + (int)*(undefined8 *)((long)&this->idx_below + 8) +
               (uint)CARRY8(uVar5,(ulong)this->idx_below) + (uint)CARRY8(uVar17,(ulong)psVar13));
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
    .first = fVar18;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x10) = local_38;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x18) = uStack_30;
    bVar11 = true;
  }
  else {
    bVar11 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = bVar11;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }